

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::NewKey
          (TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_> *this,int key)

{
  Node *pNVar1;
  PClassActor *pPVar2;
  undefined8 uVar3;
  short sVar4;
  char cVar5;
  undefined1 uVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  Node *pNVar10;
  Node *pNVar11;
  Node *pNVar12;
  Node *pNVar13;
  hash_t hVar14;
  uint uVar15;
  uint uVar16;
  
  pNVar11 = this->Nodes;
  hVar14 = this->Size;
  do {
    uVar16 = hVar14 - 1 & key;
    pNVar1 = pNVar11 + uVar16;
    pNVar10 = pNVar11[uVar16].Next;
    if (pNVar10 == (Node *)0x1) {
LAB_004d9eb8:
      pNVar13 = (Node *)0x0;
      pNVar11 = pNVar1;
LAB_004d9ebd:
      pNVar1->Next = pNVar13;
      this->NumUsed = this->NumUsed + 1;
      (pNVar11->Pair).Key = key;
      return pNVar11;
    }
    pNVar13 = this->LastFree;
    while (pNVar12 = pNVar13, pNVar13 = pNVar12 + -1, pNVar11 < pNVar12) {
      if (pNVar13->Next == (Node *)0x1) {
        this->LastFree = pNVar13;
        uVar15 = hVar14 - 1 & (pNVar1->Pair).Key;
        if (uVar15 != uVar16) {
          pNVar11 = pNVar11 + uVar15;
          do {
            pNVar10 = pNVar11;
            pNVar11 = pNVar10->Next;
          } while (pNVar11 != pNVar1);
          pNVar10->Next = pNVar13;
          pNVar11 = pNVar1->Next;
          iVar8 = (pNVar1->Pair).Key;
          uVar9 = *(undefined4 *)&(pNVar1->Pair).field_0x4;
          pPVar2 = (pNVar1->Pair).Value.Type;
          sVar4 = (pNVar1->Pair).Value.Special;
          cVar5 = (pNVar1->Pair).Value.ArgsDefined;
          uVar6 = (pNVar1->Pair).Value.field_0xb;
          iVar7 = (pNVar1->Pair).Value.Args[0];
          uVar3 = *(undefined8 *)((pNVar1->Pair).Value.Args + 3);
          *(undefined8 *)(pNVar12[-1].Pair.Value.Args + 1) =
               *(undefined8 *)((pNVar1->Pair).Value.Args + 1);
          *(undefined8 *)(pNVar12[-1].Pair.Value.Args + 3) = uVar3;
          pNVar12[-1].Pair.Value.Type = pPVar2;
          pNVar12[-1].Pair.Value.Special = sVar4;
          pNVar12[-1].Pair.Value.ArgsDefined = cVar5;
          pNVar12[-1].Pair.Value.field_0xb = uVar6;
          pNVar12[-1].Pair.Value.Args[0] = iVar7;
          pNVar13->Next = pNVar11;
          pNVar12[-1].Pair.Key = iVar8;
          *(undefined4 *)&pNVar12[-1].Pair.field_0x4 = uVar9;
          goto LAB_004d9eb8;
        }
        pNVar13->Next = pNVar10;
        pNVar11 = pNVar13;
        goto LAB_004d9ebd;
      }
    }
    this->LastFree = pNVar13;
    Resize(this,hVar14 * 2);
    pNVar11 = this->Nodes;
    hVar14 = this->Size;
  } while( true );
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}